

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void use_crystal_ball(obj *obj)

{
  uint uVar1;
  schar sVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool local_2d;
  int local_20;
  int i;
  int ret;
  int class;
  int oops;
  char ch;
  obj *obj_local;
  
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    iVar4 = 0x14;
    if ((*(uint *)&obj->field_0x4a >> 1 & 1) != 0) {
      iVar4 = 0xd;
    }
    iVar4 = rnd(iVar4);
    sVar2 = acurr(1);
    bVar7 = true;
    if (iVar4 <= sVar2) {
      bVar7 = (*(uint *)&obj->field_0x4a & 1) != 0;
    }
    if ((bVar7) && ('\0' < obj->spe)) {
      local_2d = true;
      if ((obj->oartifact == '\0') && (local_2d = true, (*(uint *)&obj->field_0x4a >> 1 & 1) == 0))
      {
        sVar2 = acurr(1);
        local_2d = '\x11' < sVar2;
      }
      iVar4 = rnd(local_2d ^ 5);
      _oops = obj;
      switch(iVar4) {
      case 1:
        pcVar5 = Tobjnam(obj,"are");
        pline("%s too much to comprehend!",pcVar5);
        break;
      case 2:
        Tobjnam(obj,"confuse");
        pline("%s you!");
        uVar1 = u.uprops[0x1c].intrinsic;
        iVar4 = rnd(100);
        make_confused((ulong)(uVar1 + iVar4),'\0');
        break;
      case 3:
        bVar3 = resists_blnd(&youmonst);
        if (bVar3 == '\0') {
          Tobjnam(obj,"damage");
          pline("%s your vision!");
          uVar1 = u.uprops[0x1e].intrinsic;
          iVar4 = rnd(100);
          make_blinded((ulong)(uVar1 + iVar4),'\0');
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pline("Your vision quickly clears.");
          }
        }
        else {
          pcVar5 = Tobjnam(obj,"assault");
          pline("%s your vision.",pcVar5);
          pline("You are unaffected!");
        }
        break;
      case 4:
        Tobjnam(obj,"zap");
        pline("%s your mind!");
        uVar1 = u.uprops[0x23].intrinsic;
        iVar4 = rnd(100);
        make_hallucinated((ulong)(uVar1 + iVar4),'\0',0);
        break;
      case 5:
        pcVar5 = Tobjnam(obj,"explode");
        pline("%s!",pcVar5);
        useup(obj);
        _oops = (obj *)0x0;
        iVar4 = rnd(0x1e);
        losehp(iVar4,"exploding crystal ball",0);
      }
      if (_oops != (obj *)0x0) {
        consume_obj_charge(_oops,'\x01');
      }
    }
    else if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
            ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
      if (flags.verbose != '\0') {
        pline("You may look for an object or monster symbol.");
      }
      class._3_1_ = query_key("What do you look for?",(int *)0x0);
      if ((class._3_1_ == ' ') ||
         (pcVar5 = strchr(" \r\n\x1b",(int)class._3_1_), pcVar5 == (char *)0x0)) {
        pcVar5 = xname(obj);
        pcVar5 = the(pcVar5);
        pline("You peer into %s...",pcVar5);
        iVar4 = 10;
        if (u.uprops[0x38].extrinsic != 0) {
          iVar4 = 2;
        }
        iVar4 = rnd(iVar4);
        nomul(-iVar4,"gazing into a crystal ball");
        nomovemsg = "";
        if (obj->spe < '\x01') {
          pline("The vision is unclear.");
        }
        else {
          discover_object(0xec,'\x01','\x01');
          consume_obj_charge(obj,'\x01');
          if (class._3_1_ == ']') {
            class._3_1_ = 'm';
          }
          iVar4 = def_char_to_objclass(class._3_1_);
          if (iVar4 == 0x12) {
            iVar4 = def_char_to_monclass(class._3_1_);
            if (iVar4 == 0x3d) {
              if (class._3_1_ == '^') {
                local_20 = trap_detect((obj *)0x0);
              }
              else {
                iVar4 = rn2(4);
                pcVar5 = level_detects[iVar4].what;
                pcVar6 = level_distance(level_detects[iVar4].where);
                pline("You see %s, %s.",pcVar5,pcVar6);
                local_20 = 0;
              }
            }
            else {
              local_20 = monster_detect((obj *)0x0,iVar4);
            }
          }
          else {
            local_20 = object_detect((obj *)0x0,iVar4,'\0');
          }
          if (local_20 != 0) {
            iVar4 = rn2(100);
            if (iVar4 == 0) {
              pline("You see the Wizard of Yendor gazing out at you.");
            }
            else {
              pline("The vision is unclear.");
            }
          }
        }
      }
      else if (flags.verbose != '\0') {
        pline("Never mind.");
      }
    }
    else if (obj->spe == '\0') {
      pcVar5 = hcolor((char *)0x0);
      pline("All you see is funky %s haze.",pcVar5);
    }
    else {
      iVar4 = rnd(6);
      switch(iVar4) {
      case 1:
        pline("You grok some groovy globs of incandescent lava.");
        break;
      case 2:
        iVar4 = poly_gender();
        pcVar5 = "dude";
        if (iVar4 == 1) {
          pcVar5 = "babe";
        }
        pline("Whoa!  Psychedelic colors, %s!",pcVar5);
        break;
      case 3:
        pcVar5 = hcolor((char *)0x0);
        pline("The crystal pulses with sinister %s light!",pcVar5);
        break;
      case 4:
        pline("You see goldfish swimming above fluorescent rocks.");
        break;
      case 5:
        pline("You see tiny snowflakes spinning around a miniature farmhouse.");
        break;
      default:
        pline("Oh wow... like a kaleidoscope!");
      }
      consume_obj_charge(obj,'\x01');
    }
  }
  else {
    pcVar5 = xname(obj);
    pcVar5 = the(pcVar5);
    pline("Too bad you can\'t see %s.",pcVar5);
  }
  return;
}

Assistant:

void use_crystal_ball(struct obj *obj)
{
    char ch;
    int oops;

    if (Blind) {
	pline("Too bad you can't see %s.", the(xname(obj)));
	return;
    }
    oops = (rnd(obj->blessed ? 13 : 20) > ACURR(A_INT) || obj->cursed);
    if (oops && (obj->spe > 0)) {
	switch (rnd((obj->oartifact || obj->blessed || ACURR(A_INT) >= 18) ? 4 : 5)) {
	case 1 : pline("%s too much to comprehend!", Tobjnam(obj, "are"));
	    break;
	case 2 : pline("%s you!", Tobjnam(obj, "confuse"));
	    make_confused(HConfusion + rnd(100),FALSE);
	    break;
	case 3 : if (!resists_blnd(&youmonst)) {
		pline("%s your vision!", Tobjnam(obj, "damage"));
		make_blinded(Blinded + rnd(100),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    } else {
		pline("%s your vision.", Tobjnam(obj, "assault"));
		pline("You are unaffected!");
	    }
	    break;
	case 4 : pline("%s your mind!", Tobjnam(obj, "zap"));
	    make_hallucinated(HHallucination + rnd(100),FALSE,0L);
	    break;
	case 5 : pline("%s!", Tobjnam(obj, "explode"));
	    useup(obj);
	    obj = 0;	/* it's gone */
	    losehp(rnd(30), "exploding crystal ball", KILLED_BY_AN);
	    break;
	}
	if (obj) consume_obj_charge(obj, TRUE);
	return;
    }

    if (Hallucination) {
	if (!obj->spe) {
	    pline("All you see is funky %s haze.", hcolor(NULL));
	} else {
	    switch(rnd(6)) {
	    case 1 : pline("You grok some groovy globs of incandescent lava.");
		break;
	    case 2 : pline("Whoa!  Psychedelic colors, %s!",
			   poly_gender() == 1 ? "babe" : "dude");
		break;
	    case 3 : pline("The crystal pulses with sinister %s light!",
				hcolor(NULL));
		break;
	    case 4 : pline("You see goldfish swimming above fluorescent rocks.");
		break;
	    case 5 : pline("You see tiny snowflakes spinning around a miniature farmhouse.");
		break;
	    default: pline("Oh wow... like a kaleidoscope!");
		break;
	    }
	    consume_obj_charge(obj, TRUE);
	}
	return;
    }

    /* read a single character */
    if (flags.verbose) pline("You may look for an object or monster symbol.");
    ch = query_key("What do you look for?", NULL);
    /* Don't filter out ' ' here; it has a use */
    if ((ch != def_monsyms[S_GHOST]) && strchr(quitchars,ch)) { 
	if (flags.verbose) pline("Never mind.");
	return;
    }
    pline("You peer into %s...", the(xname(obj)));
    nomul(-rnd(Free_action ? 2 : 10), "gazing into a crystal ball");
    nomovemsg = "";
    if (obj->spe <= 0)
	pline("The vision is unclear.");
    else {
	int class;
	int ret = 0;

	makeknown(CRYSTAL_BALL);
	consume_obj_charge(obj, TRUE);

	/* special case: accept ']' as synonym for mimic
	 * we have to do this before the def_char_to_objclass check
	 */
	if (ch == DEF_MIMIC_DEF) ch = DEF_MIMIC;

	if ((class = def_char_to_objclass(ch)) != MAXOCLASSES)
		ret = object_detect(NULL, class, FALSE);
	else if ((class = def_char_to_monclass(ch)) != MAXMCLASSES)
		ret = monster_detect(NULL, class);
	else switch(ch) {
		case '^':
		    ret = trap_detect(NULL);
		    break;
		default:
		    {
		    int i = rn2(SIZE(level_detects));
		    pline("You see %s, %s.",
			level_detects[i].what,
			level_distance(level_detects[i].where));
		    }
		    ret = 0;
		    break;
	}

	if (ret) {
	    if (!rn2(100))  /* make them nervous */
		pline("You see the Wizard of Yendor gazing out at you.");
	    else pline("The vision is unclear.");
	}
    }
    return;
}